

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O2

void __thiscall
Minisat::IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
          (IntSet<Minisat::Lit,_Minisat::MkIndexLit> *this,bool free)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  int i;
  long lVar2;
  
  if ((int)CONCAT71(in_register_00000031,free) == 0) {
    for (lVar2 = 0; lVar2 < (this->xs).sz; lVar2 = lVar2 + 1) {
      pcVar1 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[]
                         (&this->in_set,(Lit)(this->xs).data[lVar2].x);
      *pcVar1 = '\0';
    }
  }
  else {
    vec<char,_int>::clear((vec<char,_int> *)this,true);
  }
  vec<Minisat::Lit,_int>::clear(&this->xs,free);
  return;
}

Assistant:

void     clear       (bool free = false){
            if (free)
                in_set.clear(true); 
            else
                for (int i = 0; i < xs.size(); i++)
                    in_set[xs[i]] = 0;
            xs.clear(free);
        }